

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall embree::TutorialApplication::set_scene(TutorialApplication *this,TutorialScene *in)

{
  pointer in_RDI;
  TutorialScene *in_stack_00000070;
  RTCDevice in_stack_00000078;
  ISPCScene *in_stack_00000080;
  pointer this_00;
  
  this_00 = in_RDI + 0xe;
  ISPCScene::operator_new(0x13677c);
  ISPCScene::ISPCScene(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  std::unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>::reset
            ((unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *)this_00,
             in_RDI);
  g_ispc_scene = std::unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>::get
                           ((unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>
                             *)this_00);
  return;
}

Assistant:

void TutorialApplication::set_scene (TutorialScene* in)
  {
    ispc_scene.reset(new ISPCScene(g_device,in));
    g_ispc_scene = ispc_scene.get();
  }